

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O0

vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *
detectFaces(vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__return_storage_ptr__,
           Mat *gray)

{
  Size_<int> local_90;
  Size_<int> local_88;
  _InputArray local_80;
  allocator<char> local_51;
  string local_50 [39];
  undefined1 local_29;
  CascadeClassifier local_28 [8];
  CascadeClassifier facesCascade;
  Mat *gray_local;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *faces;
  
  cv::CascadeClassifier::CascadeClassifier(local_28);
  local_29 = 0;
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"/usr/local/share/opencv4/haarcascades/haarcascade_frontalface_default.xml",
             &local_51);
  cv::CascadeClassifier::load((string *)local_28);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  cv::_InputArray::_InputArray(&local_80,gray);
  cv::Size_<int>::Size_(&local_88,0x1e,0x1e);
  cv::Size_<int>::Size_(&local_90);
  cv::CascadeClassifier::detectMultiScale
            (0x3ff199999999999a,local_28,&local_80,__return_storage_ptr__,2,2,&local_88,&local_90);
  cv::_InputArray::~_InputArray(&local_80);
  local_29 = 1;
  cv::CascadeClassifier::~CascadeClassifier(local_28);
  return __return_storage_ptr__;
}

Assistant:

vector<Rect> detectFaces(Mat gray) {
  CascadeClassifier facesCascade;
  vector<Rect> faces;
  facesCascade.load(
      "/usr/local/share/opencv4/haarcascades/"
      "haarcascade_frontalface_default.xml");
  facesCascade.detectMultiScale(gray, faces, 1.1, 2, 0 | CASCADE_SCALE_IMAGE,
                                Size(30, 30));
  return faces;
}